

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error fp_rounding<50>(context *ctx,token *token,opcode *op)

{
  ulong *in_RCX;
  ulong uVar1;
  string_view prefix;
  optional<unsigned_long> oVar2;
  token local_58;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar2 = find_in_table((token *)op,fp_rounding<50>::table,prefix);
  if (((undefined1  [16])
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    uVar1 = 0;
  }
  else {
    context::tokenize(&local_58,(context *)token);
    *(int *)&op[2].value = local_58.column;
    op[1].value = (uint64_t)local_58.data.string._M_str;
    op[1].reuse = local_58.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.line;
    op->value = (uint64_t)local_58.filename;
    op->reuse = local_58.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_58.data.predicate.negated;
    uVar1 = oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload << 0x32;
  }
  if ((*in_RCX & uVar1) == 0) {
    *in_RCX = *in_RCX | uVar1;
    ctx->pc = 0;
    return (unique_ptr<char[],_std::default_delete<char[]>_>)
           (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  }
  __assert_fail("(value & bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                ,0x31,"void opcode::add_bits(uint64_t)");
}

Assistant:

DEFINE_OPERAND(bop)
{
    static const char* table[] = {"AND", "OR", "XOR", "INVALIDBOP3", nullptr};
    const std::optional<int64_t> value = find_in_table(token, table, ".");
    if (!value) {
        return fail(token, "expected .AND, .OR or .XOR");
    }
    op.add_bits(*value << address);
    token = ctx.tokenize();
    return {};
}